

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe18At2(uint8_t *buf)

{
  return (ulong)((*buf & 0x3f) << 0xc | (uint)buf[1] << 4 | (uint)(buf[2] >> 4));
}

Assistant:

std::uint64_t readFlUIntBe18At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 4;
    res |= (buf[2] >> 4);
    res &= UINT64_C(0x3ffff);
    return res;
}